

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_volumemeter.c
# Opt level: O0

void FAudioFXVolumeMeter_GetParameters
               (FAudioFXVolumeMeter *fapo,FAudioFXVolumeMeterLevels *pParameters,
               uint32_t ParameterByteSize)

{
  undefined8 *puVar1;
  code *pcVar2;
  int iVar3;
  int in_EDX;
  long *in_RSI;
  long in_RDI;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  FAudioFXVolumeMeterLevels *levels;
  
  puVar1 = *(undefined8 **)(in_RDI + 0xa8);
  do {
    if (in_EDX == 0x14) goto LAB_0012df16;
    iVar3 = SDL_ReportAssertion(&FAudioFXVolumeMeter_GetParameters::sdl_assert_data,
                                "FAudioFXVolumeMeter_GetParameters",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudioFX_volumemeter.c"
                                ,0xbe);
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    pcVar2 = (code *)swi(3);
    (*pcVar2)();
    return;
  }
LAB_0012df16:
  do {
    if (*(uint *)(in_RSI + 2) == (uint)*(ushort *)(in_RDI + 0xe0)) goto LAB_0012df6e;
    iVar3 = SDL_ReportAssertion(&FAudioFXVolumeMeter_GetParameters::sdl_assert_data_1,
                                "FAudioFXVolumeMeter_GetParameters",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudioFX_volumemeter.c"
                                ,0xbf);
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    pcVar2 = (code *)swi(3);
    (*pcVar2)();
    return;
  }
LAB_0012df6e:
  if (*in_RSI != 0) {
    SDL_memcpy(*in_RSI,*puVar1,(ulong)*(ushort *)(in_RDI + 0xe0) << 2);
  }
  if (in_RSI[1] != 0) {
    SDL_memcpy(in_RSI[1],puVar1[1],(ulong)*(ushort *)(in_RDI + 0xe0) << 2);
  }
  return;
}

Assistant:

void FAudioFXVolumeMeter_GetParameters(
	FAudioFXVolumeMeter *fapo,
	FAudioFXVolumeMeterLevels *pParameters,
	uint32_t ParameterByteSize
) {
	FAudioFXVolumeMeterLevels *levels = (FAudioFXVolumeMeterLevels*)
		fapo->base.m_pCurrentParameters;
	FAudio_assert(ParameterByteSize == sizeof(FAudioFXVolumeMeterLevels));
	FAudio_assert(pParameters->ChannelCount == fapo->channels);

	/* Copy what's current as of the last Process */
	if (pParameters->pPeakLevels != NULL)
	{
		FAudio_memcpy(
			pParameters->pPeakLevels,
			levels->pPeakLevels,
			fapo->channels * sizeof(float)
		);
	}
	if (pParameters->pRMSLevels != NULL)
	{
		FAudio_memcpy(
			pParameters->pRMSLevels,
			levels->pRMSLevels,
			fapo->channels * sizeof(float)
		);
	}
}